

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O3

void duckdb::ExecuteLambda<duckdb::ListTransformFunctor>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  optional_ptr<duckdb::Vector,_true> *this;
  DataChunk *this_00;
  uint64_t uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  byte bVar2;
  Vector *this_02;
  optional_ptr<duckdb::ValidityMask,_true> oVar3;
  bool has_index;
  element_type *peVar4;
  element_type *peVar5;
  reference_wrapper<duckdb::LambdaFunctions::ColumnInfo> *entry;
  reference pvVar6;
  idx_t iVar7;
  ClientContext *context;
  ulong uVar8;
  pointer prVar9;
  long value;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  list_entry_t *plVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  bool result_is_null;
  vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_true> mutable_column_infos;
  LambdaInfo info;
  ColumnInfo child_info;
  Vector index_vector;
  bool local_2b9;
  long local_2b8;
  Vector *local_2b0;
  data_ptr_t local_2a8;
  _Head_base<0UL,_unsigned_long_*,_false> local_2a0;
  vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_true> local_298;
  LogicalType local_280;
  LambdaInfo local_268;
  ColumnInfo local_1d0;
  element_type *local_168;
  element_type *peStack_160;
  Vector local_128;
  LambdaExecuteInfo local_c0;
  
  local_2b9 = false;
  LambdaFunctions::LambdaInfo::LambdaInfo(&local_268,args,state,result,&local_2b9);
  if (local_2b9 == false) {
    local_2a8 = result->data;
    LambdaFunctions::GetMutableColumnInfo(&local_298,&local_268.column_infos);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    iVar7 = ListVector::GetListSize(pvVar6);
    this = &local_268.child_vector;
    optional_ptr<duckdb::Vector,_true>::CheckValid(this);
    LambdaFunctions::ColumnInfo::ColumnInfo(&local_1d0,local_268.child_vector.ptr);
    local_2b0 = result;
    optional_ptr<duckdb::Vector,_true>::CheckValid(this);
    Vector::ToUnifiedFormat(local_268.child_vector.ptr,iVar7,&local_1d0.format);
    context = ExpressionState::GetContext(state);
    optional_ptr<duckdb::Expression,_true>::CheckValid(&local_268.lambda_expr);
    has_index = local_268.has_index;
    optional_ptr<duckdb::Vector,_true>::CheckValid(this);
    LambdaExecuteInfo::LambdaExecuteInfo
              (&local_c0,context,local_268.lambda_expr.ptr,args,has_index,local_268.child_vector.ptr
              );
    LogicalType::LogicalType(&local_280,BIGINT);
    Vector::Vector(&local_128,&local_280,0x800);
    LogicalType::~LogicalType(&local_280);
    if (local_268.row_count == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      uVar13 = 0;
      local_2b8 = 0;
      do {
        uVar8 = uVar13;
        if ((local_268.list_column_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_268.list_column_format.sel)->sel_vector[uVar13];
        }
        plVar12 = local_268.list_entries + uVar8;
        if ((local_268.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.
             validity_mask == (unsigned_long *)0x0) ||
           ((local_268.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.
             validity_mask[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
          *(long *)(local_2a8 + uVar13 * 0x10) = local_2b8;
          uVar1 = plVar12->length;
          *(uint64_t *)(local_2a8 + uVar13 * 0x10 + 8) = uVar1;
          local_2b8 = local_2b8 + uVar1;
          if (uVar1 != 0) {
            uVar8 = 0;
            do {
              if (iVar7 == 0x800) {
                DataChunk::Reset(&local_c0.lambda_chunk);
                ExecuteExpression(0x800,&local_1d0,&local_268.column_infos,&local_128,&local_c0);
                pvVar6 = vector<duckdb::Vector,_true>::operator[](&local_c0.lambda_chunk.data,0);
                ListVector::Append(local_2b0,pvVar6,0x800,0);
                iVar7 = 0;
              }
              local_1d0.sel.sel_vector[iVar7] = (int)plVar12->offset + (int)uVar8;
              for (prVar9 = local_298.
                            super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  prVar9 != local_298.
                            super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; prVar9 = prVar9 + 1) {
                (prVar9->_M_data->sel).sel_vector[iVar7] = (sel_t)uVar13;
              }
              if (local_268.has_index != false) {
                value = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar8 + 1);
                Value::BIGINT((Value *)&local_168,value);
                Vector::SetValue(&local_128,iVar7,(Value *)&local_168);
                Value::~Value((Value *)&local_168);
              }
              uVar8 = uVar8 + 1;
              iVar7 = iVar7 + 1;
            } while (uVar8 < plVar12->length);
          }
        }
        else {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_268.result_validity);
          oVar3.ptr = local_268.result_validity.ptr;
          _Var11._M_head_impl =
               ((local_268.result_validity.ptr)->super_TemplatedValidityMask<unsigned_long>).
               validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_2a0._M_head_impl =
                 (unsigned_long *)
                 ((local_268.result_validity.ptr)->super_TemplatedValidityMask<unsigned_long>).
                 capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_168,(unsigned_long *)&local_2a0);
            peVar5 = peStack_160;
            peVar4 = local_168;
            local_168 = (element_type *)0x0;
            peStack_160 = (element_type *)0x0;
            this_01 = ((oVar3.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            ((oVar3.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            ((oVar3.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
            if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
               peStack_160 != (element_type *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_160);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&((oVar3.ptr)->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            ((oVar3.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var11._M_head_impl;
          }
          bVar2 = (byte)uVar13 & 0x3f;
          _Var11._M_head_impl[uVar13 >> 6] =
               _Var11._M_head_impl[uVar13 >> 6] &
               (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < local_268.row_count);
    }
    this_00 = &local_c0.lambda_chunk;
    DataChunk::Reset(this_00);
    ExecuteExpression(iVar7,&local_1d0,&local_268.column_infos,&local_128,&local_c0);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
    this_02 = local_2b0;
    ListVector::Append(local_2b0,pvVar6,iVar7,0);
    if ((local_268.is_all_constant == true) && (local_268.is_volatile == false)) {
      Vector::SetVectorType(this_02,CONSTANT_VECTOR);
    }
    if (local_128.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_128.type);
    DataChunk::~DataChunk(this_00);
    DataChunk::~DataChunk(&local_c0.input_chunk);
    if (local_c0.expr_executor.
        super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
        .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true,_true>
         )0x0) {
      ::std::default_delete<duckdb::ExpressionExecutor>::operator()
                ((default_delete<duckdb::ExpressionExecutor> *)&local_c0,
                 (ExpressionExecutor *)
                 local_c0.expr_executor.
                 super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
                 .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl);
    }
    if (local_1d0.format.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.format.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1d0.format.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.format.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_1d0.sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_298.
        super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.
                      super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ::std::
  vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
  ::~vector(&local_268.column_infos.
             super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
           );
  if (local_268.list_column_format.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.list_column_format.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_268.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
      .internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.
               validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ExecuteLambda(DataChunk &args, ExpressionState &state, Vector &result) {

	bool result_is_null = false;
	LambdaFunctions::LambdaInfo info(args, state, result, result_is_null);
	if (result_is_null) {
		return;
	}

	auto result_entries = FlatVector::GetData<list_entry_t>(result);
	auto mutable_column_infos = LambdaFunctions::GetMutableColumnInfo(info.column_infos);

	// special-handling for the child_vector
	auto child_vector_size = ListVector::GetListSize(args.data[0]);
	LambdaFunctions::ColumnInfo child_info(*info.child_vector);
	info.child_vector->ToUnifiedFormat(child_vector_size, child_info.format);

	// get the expression executor
	LambdaExecuteInfo execute_info(state.GetContext(), *info.lambda_expr, args, info.has_index, *info.child_vector);

	// get list_filter specific info
	ListFilterInfo list_filter_info;
	FUNCTION_FUNCTOR::ReserveNewLengths(list_filter_info.entry_lengths, info.row_count);

	// additional index vector
	Vector index_vector(LogicalType::BIGINT);

	// loop over the child entries and create chunks to be executed by the expression executor
	idx_t elem_cnt = 0;
	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < info.row_count; row_idx++) {

		auto list_idx = info.list_column_format.sel->get_index(row_idx);
		const auto &list_entry = info.list_entries[list_idx];

		// set the result to NULL for this row
		if (!info.list_column_format.validity.RowIsValid(list_idx)) {
			info.result_validity->SetInvalid(row_idx);
			FUNCTION_FUNCTOR::PushEmptyList(list_filter_info.entry_lengths);
			continue;
		}

		FUNCTION_FUNCTOR::SetResultEntry(result_entries, offset, list_entry, row_idx, list_filter_info.entry_lengths);

		// empty list, nothing to execute
		if (list_entry.length == 0) {
			continue;
		}

		// iterate the elements of the current list and create the corresponding selection vectors
		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {

			// reached STANDARD_VECTOR_SIZE elements
			if (elem_cnt == STANDARD_VECTOR_SIZE) {

				execute_info.lambda_chunk.Reset();
				ExecuteExpression(elem_cnt, child_info, info.column_infos, index_vector, execute_info);
				auto &lambda_vector = execute_info.lambda_chunk.data[0];

				FUNCTION_FUNCTOR::AppendResult(result, lambda_vector, elem_cnt, result_entries, list_filter_info,
				                               execute_info);
				elem_cnt = 0;
			}

			// FIXME: reuse same selection vector for inconstant rows
			// adjust indexes for slicing
			child_info.sel.set_index(elem_cnt, list_entry.offset + child_idx);
			for (auto &entry : mutable_column_infos) {
				entry.get().sel.set_index(elem_cnt, row_idx);
			}

			// set the index vector
			if (info.has_index) {
				index_vector.SetValue(elem_cnt, Value::BIGINT(NumericCast<int64_t>(child_idx + 1)));
			}

			elem_cnt++;
		}
	}

	execute_info.lambda_chunk.Reset();
	ExecuteExpression(elem_cnt, child_info, info.column_infos, index_vector, execute_info);
	auto &lambda_vector = execute_info.lambda_chunk.data[0];

	FUNCTION_FUNCTOR::AppendResult(result, lambda_vector, elem_cnt, result_entries, list_filter_info, execute_info);

	if (info.is_all_constant && !info.is_volatile) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}